

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O1

void __thiscall QWidgetAction::releaseWidget(QWidgetAction *this,QWidget *widget)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QWidget *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QWidget *local_50;
  undefined8 local_48;
  anon_class_8_1_54a39814_for__M_pred local_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  if ((*(long *)(lVar2 + 0x1a8) == 0) || (*(int *)(*(long *)(lVar2 + 0x1a8) + 4) == 0)) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    pQVar4 = *(QWidget **)(lVar2 + 0x1b0);
  }
  if (pQVar4 == widget) {
    QWidget::hide(*(QWidget **)(lVar2 + 0x1b0));
    QWidget::setParent(*(QWidget **)(lVar2 + 0x1b0),(QWidget *)0x0);
    *(byte *)(lVar2 + 0x1d0) = *(byte *)(lVar2 + 0x1d0) & 0xfe;
    goto LAB_0039f128;
  }
  if (*(long *)(lVar2 + 0x1c8) == 0) {
LAB_0039f07b:
    pQVar4 = (QWidget *)0xffffffffffffffff;
  }
  else {
    lVar5 = -8;
    do {
      lVar1 = *(long *)(lVar2 + 0x1c8) * -8 + lVar5;
      if (lVar1 == -8) goto LAB_0039f075;
      pQVar4 = (QWidget *)(lVar5 + 8);
      lVar3 = lVar5 + 8;
      lVar5 = (long)pQVar4;
    } while (*(QWidget **)(lVar3 + *(long *)(lVar2 + 0x1c0)) != widget);
    pQVar4 = (QWidget *)((long)pQVar4 >> 3);
LAB_0039f075:
    if (lVar1 == -8) goto LAB_0039f07b;
  }
  if (pQVar4 != (QWidget *)0xffffffffffffffff) {
    local_40.t = (QWindow **)QObject::destroyed;
    local_38 = 0;
    local_50 = (QWidget *)QWidgetActionPrivate::widgetDestroyed;
    local_48 = 0;
    QObject::disconnectImpl
              (&widget->super_QObject,&local_40.t,*(QObject **)(lVar2 + 8),&local_50,
               (QMetaObject *)&QObject::staticMetaObject);
    local_50 = widget;
    local_40.t = (QWindow **)&local_50;
    QtPrivate::
    sequential_erase_if<QList<QWidget*>,QtPrivate::sequential_erase<QList<QWidget*>,QWidget*>(QList<QWidget*>&,QWidget*const&)::_lambda(auto:1_const&)_1_>
              ((QList<QWidget_*> *)(lVar2 + 0x1b8),&local_40);
    (**(code **)(*(long *)this + 0x68))(this,widget);
  }
LAB_0039f128:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetAction::releaseWidget(QWidget *widget)
{
    Q_D(QWidgetAction);

    if (widget == d->defaultWidget) {
        d->defaultWidget->hide();
        d->defaultWidget->setParent(nullptr);
        d->defaultWidgetInUse = false;
        return;
    }

    if (!d->createdWidgets.contains(widget))
        return;

    QObjectPrivate::disconnect(widget, &QWidget::destroyed,
                               d, &QWidgetActionPrivate::widgetDestroyed);
    d->createdWidgets.removeAll(widget);
    deleteWidget(widget);
}